

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TDefaultGlslIoResolver::reserverStorageSlot
          (TDefaultGlslIoResolver *this,TVarEntryInfo *ent,TInfoSink *infoSink)

{
  uint uVar1;
  TType *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  TQualifier *pTVar6;
  uint *puVar7;
  pointer ppVar8;
  char *pcVar9;
  EShLanguage local_100;
  EShLanguage local_fc;
  undefined1 local_d8 [8];
  TString errorMsg_1;
  iterator iStack_a8;
  int numLocations_1;
  _Self local_a0;
  iterator iter_1;
  TVarSlotMap *varSlotMap_1;
  int location_1;
  int storageKey_1;
  TString errorMsg;
  iterator iStack_58;
  int numLocations;
  _Self local_50;
  iterator iter;
  TVarSlotMap *varSlotMap;
  int location;
  int storageKey;
  EShLanguage stage;
  TStorageQualifier storage;
  TString *name;
  TType *type;
  TInfoSink *infoSink_local;
  TVarEntryInfo *ent_local;
  TDefaultGlslIoResolver *this_local;
  
  type = (TType *)infoSink;
  infoSink_local = (TInfoSink *)ent;
  ent_local = (TVarEntryInfo *)this;
  iVar4 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  name = (TString *)CONCAT44(extraout_var,iVar4);
  _stage = (key_type *)
           (**(code **)(*(long *)(infoSink_local->info).sink._M_string_length + 0x1a0))();
  lVar5 = (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
  storageKey = *(uint *)(lVar5 + 8) & 0x7f;
  location = 0xe;
  if (storageKey - 3U < 2) {
    pTVar6 = (TQualifier *)
             (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
    bVar3 = TQualifier::hasLocation(pTVar6);
    if (bVar3) {
      if (storageKey == 3) {
        local_fc = this->preStage;
      }
      else {
        local_fc = location;
      }
      if (storageKey == 4) {
        local_100 = this->currentStage;
      }
      else {
        local_100 = local_fc;
      }
      location = local_100;
      varSlotMap_1._4_4_ = buildStorageKey(this,local_100,EvqInOut);
      lVar5 = (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
      varSlotMap_1._0_4_ = (uint)*(undefined8 *)(lVar5 + 0x1c) & 0xfff;
      iter_1._M_node =
           (_Base_ptr)
           std::
           map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
           ::operator[](&this->storageSlotMap,(key_type_conflict1 *)((long)&varSlotMap_1 + 4));
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                   *)iter_1._M_node,_stage);
      iStack_a8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                  ::end(iter_1._M_node);
      bVar3 = std::operator==(&local_a0,&stack0xffffffffffffff58);
      if (bVar3) {
        errorMsg_1.field_2._12_4_ = TIntermediate::computeTypeUniformLocationSize((TType *)name);
        TDefaultIoResolverBase::reserveSlot
                  (&this->super_TDefaultIoResolverBase,varSlotMap_1._4_4_,(uint)varSlotMap_1,
                   errorMsg_1.field_2._12_4_);
        uVar1 = (uint)varSlotMap_1;
        puVar7 = (uint *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                                       *)iter_1._M_node,_stage);
        *puVar7 = uVar1;
      }
      else {
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>
                 ::operator->(&local_a0);
        if (ppVar8->second != (uint)varSlotMap_1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_d8,"Invalid location: ",_stage);
          pTVar2 = type;
          pcVar9 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_d8);
          TInfoSinkBase::message((TInfoSinkBase *)pTVar2,EPrefixInternalError,pcVar9);
          (this->super_TDefaultIoResolverBase).hasError = true;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_d8);
        }
      }
    }
  }
  else if ((storageKey == 5) &&
          (iVar4 = (*(code *)(((name->_M_dataplus).super_allocator_type.allocator)->stack).
                             super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                             ._M_impl.super__Vector_impl_data._M_start)(), iVar4 != 0x10)) {
    pTVar6 = (TQualifier *)
             (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
    bVar3 = TQualifier::hasLocation(pTVar6);
    if (bVar3) {
      varSlotMap._4_4_ = buildStorageKey(this,EShLangCount,EvqUniform);
      lVar5 = (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
      varSlotMap._0_4_ = (uint)*(undefined8 *)(lVar5 + 0x1c) & 0xfff;
      iter._M_node = (_Base_ptr)
                     std::
                     map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
                     ::operator[](&this->storageSlotMap,
                                  (key_type_conflict1 *)((long)&varSlotMap + 4));
      local_50._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                   *)iter._M_node,_stage);
      iStack_58 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                  ::end(iter._M_node);
      bVar3 = std::operator==(&local_50,&stack0xffffffffffffffa8);
      if (bVar3) {
        errorMsg.field_2._12_4_ = TIntermediate::computeTypeUniformLocationSize((TType *)name);
        TDefaultIoResolverBase::reserveSlot
                  (&this->super_TDefaultIoResolverBase,varSlotMap._4_4_,(uint)varSlotMap,
                   errorMsg.field_2._12_4_);
        uVar1 = (uint)varSlotMap;
        puVar7 = (uint *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                                       *)iter._M_node,_stage);
        *puVar7 = uVar1;
      }
      else {
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>
                 ::operator->(&local_50);
        if (ppVar8->second != (uint)varSlotMap) {
          std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)&location_1,"Invalid location: ",_stage);
          pTVar2 = type;
          pcVar9 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)&location_1);
          TInfoSinkBase::message((TInfoSinkBase *)pTVar2,EPrefixInternalError,pcVar9);
          (this->super_TDefaultIoResolverBase).hasError = true;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)&location_1);
        }
      }
    }
  }
  return;
}

Assistant:

void TDefaultGlslIoResolver::reserverStorageSlot(TVarEntryInfo& ent, TInfoSink& infoSink) {
    const TType& type = ent.symbol->getType();
    const TString& name = ent.symbol->getAccessName();
    TStorageQualifier storage = type.getQualifier().storage;
    EShLanguage stage(EShLangCount);
    switch (storage) {
    case EvqUniform:
        if (type.getBasicType() != EbtBlock && type.getQualifier().hasLocation()) {
            //
            // Reserve the slots for the uniforms who has explicit location
            int storageKey = buildStorageKey(EShLangCount, EvqUniform);
            int location = type.getQualifier().layoutLocation;
            TVarSlotMap& varSlotMap = storageSlotMap[storageKey];
            TVarSlotMap::iterator iter = varSlotMap.find(name);
            if (iter == varSlotMap.end()) {
                int numLocations = TIntermediate::computeTypeUniformLocationSize(type);
                reserveSlot(storageKey, location, numLocations);
                varSlotMap[name] = location;
            } else {
                // Allocate location by name for OpenGL driver, so the uniform in different
                // stages should be declared with the same location
                if (iter->second != location) {
                    TString errorMsg = "Invalid location: " + name;
                    infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
                    hasError = true;
                }
            }
        }
        break;
    case EvqVaryingIn:
    case EvqVaryingOut:
        //
        // Reserve the slots for the inout who has explicit location
        if (type.getQualifier().hasLocation()) {
            stage = storage == EvqVaryingIn ? preStage : stage;
            stage = storage == EvqVaryingOut ? currentStage : stage;
            int storageKey = buildStorageKey(stage, EvqInOut);
            int location = type.getQualifier().layoutLocation;
            TVarSlotMap& varSlotMap = storageSlotMap[storageKey];
            TVarSlotMap::iterator iter = varSlotMap.find(name);
            if (iter == varSlotMap.end()) {
                int numLocations = TIntermediate::computeTypeUniformLocationSize(type);
                reserveSlot(storageKey, location, numLocations);
                varSlotMap[name] = location;
            } else {
                // Allocate location by name for OpenGL driver, so the uniform in different
                // stages should be declared with the same location
                if (iter->second != location) {
                    TString errorMsg = "Invalid location: " + name;
                    infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
                    hasError = true;
                }
            }
        }
        break;
    default:
        break;
    }
}